

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O1

ssize_t Omega_h::gmsh::write(int __fd,void *__buf,size_t __n)

{
  int *piVar1;
  undefined8 uVar2;
  Alloc *pAVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  I32 IVar5;
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  ostream *poVar9;
  undefined7 uVar11;
  undefined7 extraout_var;
  ssize_t sVar10;
  ssize_t extraout_RAX;
  int iVar12;
  Mesh *pMVar13;
  undefined1 *puVar14;
  undefined *puVar15;
  ulong uVar16;
  string *psVar17;
  long lVar18;
  Int ent_dim;
  undefined4 in_register_0000003c;
  int iVar19;
  long lVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  element_type *peVar23;
  bool bVar24;
  HostRead<signed_char> h_class_dims;
  Read<signed_char> d_class_dims;
  Read<signed_char> d_class_dims_1;
  HostRead<int> h_ents2verts;
  HostRead<signed_char> h_class_dims_1;
  HostRead<int> h_class_ids;
  HostRead<double> h_coords;
  Reals d_coords;
  char local_15d;
  int local_15c;
  undefined1 local_158 [32];
  undefined8 local_138;
  string *local_130;
  pointer local_128;
  Mesh *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  Alloc *local_110;
  element_type *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_f8;
  Read<signed_char> local_f0;
  Read<signed_char> local_e0;
  Read<signed_char> local_d0;
  Read<signed_char> local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  element_type *local_a8;
  Read<signed_char> local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  element_type *local_88;
  HostRead<int> local_80;
  HostRead<signed_char> local_70;
  HostRead<int> local_60;
  HostRead<double> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  poVar9 = (ostream *)CONCAT44(in_register_0000003c,__fd);
  Omega_h::Mesh::comm((Mesh *)__buf);
  IVar5 = Comm::size((Comm *)local_158._0_8_);
  if (IVar5 != 1) {
    fail("assertion %s failed at %s +%d\n","mesh->comm()->size() == 1",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x2c6);
  }
  if ((element_type *)local_158._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$MeshFormat\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"2.2 0 ",6);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  local_158[0] = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_158,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$EndMeshFormat\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$Nodes\n",7);
  uVar6 = Omega_h::Mesh::nverts((Mesh *)__buf);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar6);
  local_158[0] = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_158,1);
  local_128 = (pointer)(ulong)*(uint *)((long)__buf + 4);
  if ((pointer)0x3 < local_128) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  Omega_h::Mesh::coords((Mesh *)&local_40);
  local_a0.write_.shared_alloc_.alloc = (Alloc *)local_40._M_pi;
  if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_40._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = local_38._M_pi;
  HostRead<double>::HostRead(&local_50,&local_a0);
  pAVar3 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)local_a0.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var22->_vptr__Sp_counted_base = *(int *)&p_Var22->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var22->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  lVar18 = *(long *)poVar9;
  lVar20 = *(long *)(lVar18 + -0x18);
  *(uint *)(poVar9 + lVar20 + 0x18) = *(uint *)(poVar9 + lVar20 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar9 + *(long *)(lVar18 + -0x18) + 8) = 0x11;
  local_120 = (Mesh *)__buf;
  if (0 < (int)uVar6) {
    iVar19 = (int)local_128;
    local_130 = (string *)0x1;
    if (1 < iVar19) {
      local_130 = (string *)((ulong)local_128 & 0xffffffff);
    }
    iVar12 = 2;
    if (2 < iVar19) {
      iVar12 = iVar19;
    }
    local_138 = (long)local_128 * 8;
    local_15c = (iVar12 - iVar19) + 1;
    p_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar6;
    do {
      local_100._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_100._M_pi)->_vptr__Sp_counted_base + 1);
      std::ostream::operator<<((ostream *)poVar9,(int)local_100._M_pi);
      psVar17 = local_130;
      iVar19 = local_15c;
      local_f8 = p_Var21;
      if (local_128 == (pointer)0x0) {
LAB_002d54fa:
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," 0",2);
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      else {
        do {
          local_158[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_158,1);
          std::ostream::_M_insert<double>
                    (*(double *)
                      ((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                              &p_Var21->_M_pi)->_M_ptr +
                      (long)(_func_int ***)local_50.read_.write_.shared_alloc_.direct_ptr));
          p_Var21 = p_Var21 + 1;
          psVar17 = (string *)((long)psVar17 - 1);
        } while (psVar17 != (string *)0x0);
        iVar19 = local_15c;
        if ((uint)local_128 != 3) goto LAB_002d54fa;
      }
      local_158[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_158,1);
      p_Var21 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                        &local_f8->_M_pi)->_M_ptr + local_138);
    } while (local_100._M_pi != local_118);
  }
  pMVar13 = local_120;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$EndNodes\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$Elements\n",10);
  local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_118._4_4_,pMVar13->family_);
  iVar19 = 0;
  uVar6 = 0;
  do {
    uVar7 = Omega_h::Mesh::nents(local_120,uVar6);
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"class_dim","");
    Omega_h::Mesh::get_array<signed_char>((Mesh *)&local_110,(Int)local_120,(string *)(ulong)uVar6);
    if ((Alloc *)local_158._0_8_ != (Alloc *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,(ulong)((long)(_func_int ***)local_158._16_8_ + 1));
    }
    local_c0.write_.shared_alloc_.alloc = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c0.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
      }
      else {
        local_110->use_count = local_110->use_count + 1;
      }
    }
    local_c0.write_.shared_alloc_.direct_ptr = local_108;
    HostRead<signed_char>::HostRead((HostRead<signed_char> *)local_158,&local_c0);
    pAVar3 = local_c0.write_.shared_alloc_.alloc;
    if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)local_c0.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var22->_vptr__Sp_counted_base = *(int *)&p_Var22->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var22->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    uVar2 = local_158._0_8_;
    if (0 < (int)uVar7) {
      uVar16 = 0;
      do {
        iVar19 = iVar19 + (uint)(uVar6 == (int)*(char *)((long)(Library **)local_158._8_8_ + uVar16)
                                );
        uVar16 = uVar16 + 1;
      } while (uVar7 != uVar16);
    }
    if ((local_158._0_8_ & 7) == 0 && (Alloc *)local_158._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_158._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_158._0_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    pAVar3 = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      piVar1 = &local_110->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_110);
        operator_delete(pAVar3,0x48);
      }
    }
    bVar24 = uVar6 != (uint)local_128;
    uVar6 = uVar6 + 1;
  } while (bVar24);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar19);
  local_158[0] = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_158,1);
  psVar17 = (string *)0x0;
  local_15c = 0;
  pMVar13 = local_120;
  do {
    local_130 = psVar17;
    uVar6 = Omega_h::Mesh::nents(pMVar13,(Int)psVar17);
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"class_id","");
    ent_dim = (Int)pMVar13;
    Omega_h::Mesh::get_array<int>((Mesh *)&local_110,ent_dim,local_130);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,(ulong)((long)(_func_int ***)local_158._16_8_ + 1));
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"class_dim","");
    pMVar13 = (Mesh *)local_158;
    Omega_h::Mesh::get_array<signed_char>((Mesh *)&local_b0,ent_dim,local_130);
    if ((Alloc *)local_158._0_8_ != (Alloc *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,(ulong)((long)(_func_int ***)local_158._16_8_ + 1));
    }
    psVar17 = local_130;
    Omega_h::Mesh::ask_verts_of((Mesh *)local_158,ent_dim);
    local_d0.write_.shared_alloc_.alloc = local_110;
    puVar14 = (undefined1 *)CONCAT71((int7)((ulong)pMVar13 >> 8),local_110 == (Alloc *)0x0);
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      puVar14 = &entering_parallel;
      if (entering_parallel == '\x01') {
        local_d0.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
      }
      else {
        local_110->use_count = local_110->use_count + 1;
      }
    }
    local_d0.write_.shared_alloc_.direct_ptr = local_108;
    HostRead<int>::HostRead(&local_60,&local_d0);
    pAVar3 = local_d0.write_.shared_alloc_.alloc;
    uVar11 = (undefined7)((ulong)puVar14 >> 8);
    if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_e0.write_.shared_alloc_.alloc = (Alloc *)local_b0._M_pi;
    puVar14 = (undefined1 *)CONCAT71(uVar11,(Alloc *)local_b0._M_pi == (Alloc *)0x0);
    if (((ulong)local_b0._M_pi & 7) == 0 && (Alloc *)local_b0._M_pi != (Alloc *)0x0) {
      puVar14 = &entering_parallel;
      if (entering_parallel == '\x01') {
        local_e0.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_b0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_b0._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_b0._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_e0.write_.shared_alloc_.direct_ptr = local_a8;
    HostRead<signed_char>::HostRead(&local_70,&local_e0);
    pAVar3 = local_e0.write_.shared_alloc_.alloc;
    uVar11 = (undefined7)((ulong)puVar14 >> 8);
    if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_f0.write_.shared_alloc_.alloc = (Alloc *)local_158._0_8_;
    puVar14 = (undefined1 *)CONCAT71(uVar11,(Alloc *)local_158._0_8_ == (Alloc *)0x0);
    if ((local_158._0_8_ & 7) == 0 && (Alloc *)local_158._0_8_ != (Alloc *)0x0) {
      puVar14 = &entering_parallel;
      if (entering_parallel == '\x01') {
        local_f0.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_158._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_158._0_8_ + 0x30) = *(int *)(local_158._0_8_ + 0x30) + 1;
      }
    }
    local_f0.write_.shared_alloc_.direct_ptr = (void *)local_158._8_8_;
    HostRead<int>::HostRead(&local_80,&local_f0);
    pAVar3 = local_f0.write_.shared_alloc_.alloc;
    uVar11 = (undefined7)((ulong)puVar14 >> 8);
    if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    if ((int)local_118 == 0) {
      if (3 < (uint)psVar17) goto switchD_002d59e6_default;
      local_138 = CONCAT44(local_138._4_4_,(int)CONCAT71(uVar11,1));
      switch((ulong)psVar17 & 0xffffffff) {
      case 0:
        uVar7 = 1;
        break;
      case 1:
        uVar7 = 2;
        break;
      case 2:
        uVar7 = 3;
        break;
      case 3:
        uVar7 = 4;
      }
    }
    else {
      switch((ulong)psVar17 & 0xffffffff) {
      case 0:
        uVar7 = 1;
        break;
      case 1:
        uVar7 = 2;
        break;
      case 2:
        uVar7 = 4;
        break;
      case 3:
        uVar7 = 8;
        break;
      default:
switchD_002d59e6_default:
        uVar7 = 0xffffffff;
        local_138 = (ulong)local_138._4_4_ << 0x20;
        goto LAB_002d5a3a;
      }
      local_138 = CONCAT44(local_138._4_4_,0x454701);
    }
LAB_002d5a3a:
    if (0 < (int)uVar6) {
      local_88 = (element_type *)0x1;
      if (1 < (int)uVar7) {
        local_88 = (element_type *)(ulong)uVar7;
      }
      local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar6;
      local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(int)(uint)psVar17;
      local_f8 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)(int)uVar7 << 2);
      lVar18 = 0;
      p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar19 = (int)local_118;
      do {
        if ((uint)psVar17 ==
            (int)*(char *)((long)&p_Var22->_vptr__Sp_counted_base +
                          (long)(_func_int ***)local_70.read_.write_.shared_alloc_.direct_ptr)) {
          local_15c = local_15c + 1;
          std::ostream::operator<<((ostream *)poVar9,local_15c);
          local_15d = ' ';
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_15d,1);
          iVar12 = -1;
          if (iVar19 == 1) {
            puVar15 = &DAT_00454a44;
joined_r0x002d5bd4:
            if ((uint)psVar17 < 4) {
              iVar12 = *(int *)(puVar15 + (long)local_90._M_pi * 4);
            }
          }
          else if (iVar19 == 0) {
            puVar15 = &DAT_00454a34;
            goto joined_r0x002d5bd4;
          }
          std::ostream::operator<<((ostream *)poVar8,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," 2",2);
          iVar19 = *(int *)((long)(_func_int ***)local_60.read_.write_.shared_alloc_.direct_ptr +
                           (long)p_Var22 * 4);
          local_15d = ' ';
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_15d,1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar19);
          local_15d = ' ';
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_15d,1);
          std::ostream::operator<<((ostream *)poVar8,iVar19);
          lVar20 = lVar18;
          peVar23 = local_88;
          if ((char)local_138 != '\0') {
            do {
              local_15d = ' ';
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_15d,1);
              std::ostream::operator<<
                        ((ostream *)poVar8,
                         *(int *)((long)(_func_int ***)
                                        local_80.read_.write_.shared_alloc_.direct_ptr + lVar20) + 1
                        );
              lVar20 = lVar20 + 4;
              peVar23 = (element_type *)
                        ((long)&peVar23[-1].codes.write_.shared_alloc_.direct_ptr + 7);
            } while (peVar23 != (element_type *)0x0);
          }
          local_15d = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_15d,1);
          psVar17 = local_130;
          iVar19 = (int)local_118;
        }
        p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var22->_vptr__Sp_counted_base + 1);
        lVar18 = (long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                        &local_f8->_M_pi)->_M_ptr + lVar18;
      } while (p_Var22 != local_100._M_pi);
    }
    pAVar3 = local_80.read_.write_.shared_alloc_.alloc;
    if (((ulong)local_80.read_.write_.shared_alloc_.alloc & 7) == 0 &&
        local_80.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)local_80.read_.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var22->_vptr__Sp_counted_base = *(int *)&p_Var22->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var22->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_80.read_.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_70.read_.write_.shared_alloc_.alloc;
    pMVar13 = local_120;
    if (((ulong)local_70.read_.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)local_70.read_.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var22->_vptr__Sp_counted_base = *(int *)&p_Var22->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var22->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_70.read_.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_60.read_.write_.shared_alloc_.alloc;
    if (((ulong)local_60.read_.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)local_60.read_.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var22->_vptr__Sp_counted_base = *(int *)&p_Var22->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var22->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_60.read_.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    uVar2 = local_158._0_8_;
    if ((local_158._0_8_ & 7) == 0 && (Alloc *)local_158._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_158._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_158._0_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    _Var4._M_pi = local_b0._M_pi;
    if (((ulong)local_b0._M_pi & 7) == 0 && (Alloc *)local_b0._M_pi != (Alloc *)0x0) {
      p_Var22 = local_b0._M_pi + 3;
      *(int *)&p_Var22->_vptr__Sp_counted_base = *(int *)&p_Var22->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var22->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_b0._M_pi);
        operator_delete(_Var4._M_pi,0x48);
      }
    }
    pAVar3 = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      piVar1 = &local_110->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_110);
        operator_delete(pAVar3,0x48);
      }
    }
    psVar17 = (string *)(ulong)((int)local_130 + 1);
    if ((int)local_130 == (uint)local_128) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$EndElements\n",0xd);
      uVar11 = (undefined7)((ulong)poVar9 >> 8);
      if (((ulong)local_50.read_.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_50.read_.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var22->_vptr__Sp_counted_base = *(int *)&p_Var22->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var22->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_50.read_.write_.shared_alloc_.alloc);
          operator_delete(local_50.read_.write_.shared_alloc_.alloc,0x48);
          uVar11 = extraout_var;
        }
      }
      sVar10 = CONCAT71(uVar11,(Alloc *)local_40._M_pi == (Alloc *)0x0);
      if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
        p_Var22 = local_40._M_pi + 3;
        *(int *)&p_Var22->_vptr__Sp_counted_base = *(int *)&p_Var22->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var22->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_40._M_pi);
          operator_delete(local_40._M_pi,0x48);
          sVar10 = extraout_RAX;
        }
      }
      return sVar10;
    }
  } while( true );
}

Assistant:

void write(std::ostream& stream, Mesh* mesh) {
  OMEGA_H_CHECK(mesh->comm()->size() == 1);
  stream << "$MeshFormat\n";
  stream << "2.2 0 " << sizeof(Real) << '\n';
  stream << "$EndMeshFormat\n";
  stream << "$Nodes\n";
  auto nverts = mesh->nverts();
  stream << nverts << '\n';
  auto dim = mesh->dim();
  auto d_coords = mesh->coords();
  auto h_coords = HostRead<Real>(d_coords);
  stream << std::scientific << std::setprecision(17);
  for (LO i = 0; i < nverts; ++i) {
    stream << (i + 1);
    for (Int j = 0; j < dim; ++j) stream << ' ' << h_coords[i * dim + j];
    for (Int j = dim; j < 3; ++j) stream << " 0";
    stream << '\n';
  }
  stream << "$EndNodes\n";
  stream << "$Elements\n";
  LO gmsh_elem_i = 0;
  auto family = mesh->family();
  for (Int ent_dim = VERT; ent_dim <= dim; ++ent_dim) {
    auto nents = mesh->nents(ent_dim);
    auto d_class_dims = mesh->get_array<Byte>(ent_dim, "class_dim");
    auto h_class_dims = HostRead<Byte>(d_class_dims);
    for (LO i = 0; i < nents; ++i) {
      if (h_class_dims[i] == ent_dim) ++gmsh_elem_i;
    }
  }
  auto gmsh_nelems = gmsh_elem_i;
  stream << gmsh_nelems << '\n';
  gmsh_elem_i = 0;
  for (Int ent_dim = VERT; ent_dim <= dim; ++ent_dim) {
    auto nents = mesh->nents(ent_dim);
    auto d_class_ids = mesh->get_array<ClassId>(ent_dim, "class_id");
    auto d_class_dims = mesh->get_array<Byte>(ent_dim, "class_dim");
    auto d_ents2verts = mesh->ask_verts_of(ent_dim);
    auto h_class_ids = HostRead<ClassId>(d_class_ids);
    auto h_class_dims = HostRead<Byte>(d_class_dims);
    auto h_ents2verts = HostRead<LO>(d_ents2verts);
    auto deg = element_degree(family, ent_dim, VERT);
    for (LO i = 0; i < nents; ++i) {
      if (h_class_dims[i] != ent_dim) continue;
      stream << ++gmsh_elem_i;
      stream << ' ' << gmsh_type(family, ent_dim);
      stream << " 2";
      auto class_id = h_class_ids[i];
      stream << ' ' << class_id << ' ' << class_id;
      for (Int j = 0; j < deg; ++j) {
        stream << ' ' << (h_ents2verts[i * deg + j] + 1);
      }
      stream << '\n';
    }
  }
  stream << "$EndElements\n";
}